

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

RowSetEntry * rowSetEntrySort(RowSetEntry *pIn)

{
  ulong uVar1;
  RowSetEntry *pRVar2;
  long lVar3;
  RowSetEntry *aBucket [40];
  undefined8 local_158 [40];
  
  memset(local_158,0,0x140);
  while (pIn != (RowSetEntry *)0x0) {
    pRVar2 = pIn->pRight;
    pIn->pRight = (RowSetEntry *)0x0;
    for (uVar1 = 0; (RowSetEntry *)local_158[uVar1] != (RowSetEntry *)0x0;
        uVar1 = (ulong)((int)uVar1 + 1)) {
      pIn = rowSetEntryMerge((RowSetEntry *)local_158[uVar1],pIn);
      local_158[uVar1] = 0;
    }
    local_158[uVar1] = pIn;
    pIn = pRVar2;
  }
  pRVar2 = (RowSetEntry *)0x0;
  for (lVar3 = 0; lVar3 != 0x28; lVar3 = lVar3 + 1) {
    pRVar2 = rowSetEntryMerge(pRVar2,(RowSetEntry *)local_158[lVar3]);
  }
  return pRVar2;
}

Assistant:

static struct RowSetEntry *rowSetEntrySort(struct RowSetEntry *pIn){
  unsigned int i;
  struct RowSetEntry *pNext, *aBucket[40];

  memset(aBucket, 0, sizeof(aBucket));
  while( pIn ){
    pNext = pIn->pRight;
    pIn->pRight = 0;
    for(i=0; aBucket[i]; i++){
      pIn = rowSetEntryMerge(aBucket[i], pIn);
      aBucket[i] = 0;
    }
    aBucket[i] = pIn;
    pIn = pNext;
  }
  pIn = 0;
  for(i=0; i<sizeof(aBucket)/sizeof(aBucket[0]); i++){
    pIn = rowSetEntryMerge(pIn, aBucket[i]);
  }
  return pIn;
}